

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  Interval *pIVar4;
  int64_t iVar5;
  ulong uVar6;
  timestamp_t tVar7;
  timestamp_t *ptVar8;
  timestamp_t *ptVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  interval_t iVar14;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  interval_t interval;
  interval_t interval_00;
  timestamp_t *extraout_RDX;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar4 = *(Interval **)rdata;
      iVar5 = rdata->micros;
      iVar13 = 0;
      ptVar8 = (timestamp_t *)count;
      ptVar9 = result_data;
      do {
        uVar1 = ldata[iVar13].days;
        iVar14.micros = (int64_t)ptVar9;
        iVar14._0_8_ = iVar5;
        iVar14 = Interval::Invert(pIVar4,iVar14);
        right_01._0_8_ = iVar14.micros;
        right_01.micros = (int64_t)ptVar8;
        tVar7 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right_01);
        result_data[iVar13].value = tVar7.value;
        iVar13 = iVar13 + 1;
        ptVar8 = result_data;
        ptVar9 = extraout_RDX;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    ptVar8 = (timestamp_t *)0x0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
LAB_01096166:
        uVar6 = uVar10;
        if (uVar10 < uVar12) {
          pIVar4 = *(Interval **)rdata;
          iVar5 = rdata->micros;
          ptVar9 = ptVar8;
          do {
            uVar1 = ldata[uVar10].days;
            interval.micros = (int64_t)result_data;
            interval._0_8_ = iVar5;
            iVar14 = Interval::Invert(pIVar4,interval);
            right._0_8_ = iVar14.micros;
            right.micros = (int64_t)ptVar9;
            tVar7 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                              ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right);
            result_data[uVar10].value = tVar7.value;
            uVar10 = uVar10 + 1;
            uVar6 = uVar12;
          } while (uVar12 != uVar10);
        }
      }
      else {
        uVar3 = puVar2[(long)ptVar8];
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        uVar6 = uVar12;
        if (uVar3 != 0) {
          if (uVar3 == 0xffffffffffffffff) goto LAB_01096166;
          uVar6 = uVar10;
          if (uVar10 < uVar12) {
            uVar11 = 0;
            ptVar9 = ptVar8;
            do {
              if ((uVar3 >> (uVar11 & 0x3f) & 1) != 0) {
                uVar1 = ldata[uVar10 + uVar11].days;
                interval_00.micros = (int64_t)result_data;
                interval_00._0_8_ = rdata->micros;
                iVar14 = Interval::Invert(*(Interval **)rdata,interval_00);
                right_00._0_8_ = iVar14.micros;
                right_00.micros = (int64_t)ptVar9;
                tVar7 = AddOperator::
                        Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                  ((AddOperator *)(ulong)uVar1,(date_t)iVar14.months,right_00);
                (result_data + uVar10)[uVar11].value = tVar7.value;
                ptVar9 = result_data + uVar10;
              }
              uVar11 = uVar11 + 1;
              uVar6 = uVar12;
            } while (uVar12 - uVar10 != uVar11);
          }
        }
      }
      uVar10 = uVar6;
      ptVar8 = (timestamp_t *)((long)&ptVar8->value + 1);
    } while (ptVar8 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}